

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::iterator_base<true>::iterator_base<true,void>
          (iterator_base<true> *this,iterator_base<false> *other)

{
  iterator_base<false> *other_local;
  iterator_base<true> *this_local;
  
  *(database_reference *)this = other->db_;
  memcpy(this + 8,&other->visited_parents_,0xd8);
  *(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    **)(this + 0xe0) = other->index_;
  std::
  unique_ptr<std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>,std::default_delete<std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>>>
  ::
  unique_ptr<std::default_delete<std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>>,void>
            ((unique_ptr<std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>,std::default_delete<std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>>>
              *)(this + 0xe8));
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::reset((unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
           *)(this + 0xe8),(pointer)0x0);
  return;
}

Assistant:

iterator_base (iterator_base<false> const & other) noexcept
                        : db_{other.db_}
                        , visited_parents_ (other.visited_parents_)
                        , index_ (other.index_) {
                    pos_.reset ();
                }